

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::find_common<_1>(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  vm_val_t *strval;
  char *pcVar4;
  vm_val_t *str_00;
  char *len_00;
  vm_val_t *pvVar5;
  size_t sVar6;
  uint *in_RCX;
  long in_RDX;
  vm_val_t *in_RDI;
  int match_len;
  int match_idx;
  int32_t i;
  size_t min_len;
  utf8_ptr strp;
  int32_t start_idx;
  CVmObjPattern *pat2;
  char *str2;
  vm_val_t *val2;
  char *basestr;
  size_t len;
  uint orig_argc;
  vm_val_t *in_stack_ffffffffffffff48;
  vm_val_t *in_stack_ffffffffffffff50;
  vm_val_t *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  int local_98;
  int local_94;
  uint local_90;
  int local_88;
  int local_84;
  utf8_ptr local_78;
  undefined4 in_stack_ffffffffffffff90;
  CVmObject *substr;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (in_RCX == (uint *)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = *in_RCX;
  }
  if ((find_common<-1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&find_common<-1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&find_common<-1>::desc,1,1);
    __cxa_guard_release(&find_common<-1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc)
    ;
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff58,&in_stack_ffffffffffffff50->typ,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff48);
  if (iVar2 != 0) {
    return 1;
  }
  strval = (vm_val_t *)vmb_get_len((char *)0x341b90);
  pcVar4 = (char *)(in_RDX + 2);
  str_00 = CVmStack::get(0);
  len_00 = vm_val_t::get_as_string(in_stack_ffffffffffffff48);
  substr = (CVmObject *)0x0;
  if (len_00 == (char *)0x0) {
    if ((str_00->typ != VM_OBJ) || (iVar2 = CVmObjPattern::is_pattern_obj(0), iVar2 == 0)) {
      err_throw(0);
    }
    substr = vm_objp(0);
  }
  if ((local_90 < 2) || (pvVar5 = CVmStack::get(1), pvVar5->typ == VM_NIL)) {
    sVar6 = utf8_ptr::s_len((char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (size_t)in_stack_ffffffffffffff58);
    local_94 = (int)sVar6;
    strval = (vm_val_t *)0x0;
  }
  else {
    CVmStack::get(1);
    iVar3 = vm_val_t::num_to_int(in_stack_ffffffffffffff50);
    utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    if (iVar3 == 0) {
      sVar6 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48)
      ;
      local_94 = (int)sVar6;
    }
    else {
      if (iVar3 < 0) {
        sVar6 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff50,
                              (size_t)in_stack_ffffffffffffff48);
        local_98 = (int)sVar6;
      }
      else {
        local_98 = -1;
      }
      local_94 = local_98;
    }
    local_94 = local_94 + iVar3;
    local_84 = 0;
    while (bVar1 = local_84 < local_94, bVar1 && strval != (vm_val_t *)0x0) {
      local_84 = local_84 + 1;
      utf8_ptr::inc((utf8_ptr *)
                    CONCAT17(bVar1 && strval != (vm_val_t *)0x0,in_stack_ffffffffffffff60),
                    (size_t *)in_stack_ffffffffffffff58);
    }
    if (local_84 < local_94) {
      vm_val_t::set_nil(in_RDI);
      goto LAB_00341e3c;
    }
    utf8_ptr::getptr(&local_78);
  }
  pcVar4 = find_last_substr(strval,pcVar4,(char *)str_00,(size_t)len_00,(char *)substr,
                            (CVmObjPattern *)CONCAT44(local_94,in_stack_ffffffffffffff90),
                            (int *)CONCAT44(local_90,in_stack_ffffffffffffffd0),(int *)in_RCX);
  if (pcVar4 == (char *)0x0) {
    vm_val_t::set_nil(in_RDI);
  }
  else {
    vm_val_t::set_int(in_RDI,local_94 + local_88 + 1);
  }
LAB_00341e3c:
  CVmStack::discard(local_90);
  return 1;
}

Assistant:

inline int CVmObjString::find_common(
    VMG_ vm_val_t *retval,
    const vm_val_t *self_val, const char *str,
    uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember where the base string strings */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *val2 = G_stk->get(0);
    const char *str2 = val2->get_as_string(vmg0_);
    CVmObjPattern *pat2 = 0;
    if (str2 != 0)
    {
        /* we have a simple string to find */
    }
    else if (val2->typ == VM_OBJ
             && CVmObjPattern::is_pattern_obj(vmg_ val2->val.obj))
    {
        /* it's a pattern */
        pat2 = (CVmObjPattern *)vm_objp(vmg_ val2->val.obj);
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if there's a starting index, skip that many characters */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character.  For reverse searches, 0 is the
         *   position past the last character.  In any case, adjust to a
         *   zero-based index.
         */
        start_idx += (start_idx == 0 && dir < 0 ? (int)strp.len(len) :
                      start_idx < 0 ? (int)strp.len(len) :
                      -1);

        /* if there's a substring, we can limit the skip */
        size_t min_len = (dir > 0 && str2 != 0 ? vmb_get_len(str2) : 0);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > min_len ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }
    else if (dir < 0)
    {
        /* 
         *   we're searching backwards, and there's no starting index, so the
         *   starting point is the end of the string 
         */
        str = str + len;
        start_idx = utf8_ptr::s_len(basestr, len);
        len = 0;
    }

    /* find the substring */
    int match_idx, match_len;
    if (dir > 0
        ? find_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                      &match_idx, &match_len) != 0
        : find_last_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                           &match_idx, &match_len) != 0)
    {
        /* found it - adjust to a 1-based value for return */
        retval->set_int(start_idx + match_idx + 1);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}